

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

void __thiscall
slang::IntervalMap<int,_int,_0U>::overlap_iterator::unionWith
          (overlap_iterator *this,int *value,allocator_type *alloc)

{
  interval<int> newKey;
  interval<int> newKey_00;
  interval<int> newKey_01;
  bool bVar1;
  uint32_t i;
  uint32_t uVar2;
  interval<int> *piVar3;
  uint32_t *puVar4;
  LeafNode<int,_int,_16U,_true> *this_00;
  NodeImpl<int,_slang::IntervalMapDetails::LeafNode<int,_int,_16U,_false>_> *this_01;
  LeafNode<int,_int,_16U,_false> *this_02;
  overlap_iterator *in_RDI;
  iterator nextIt;
  bool modifiedPath;
  LeafNode<int,_int,_16U,_false> *leaf_1;
  LeafNode<int,_int,_16U,_true> *leaf;
  interval<int> currKey;
  bool canUnionRight;
  uint32_t offset;
  anon_class_16_2_46e3eac0 updateCurrKey;
  anon_class_16_2_3faad3b2 getCurrKey;
  Path *path;
  IntervalMap<int,_int,_0U> *map;
  undefined4 in_stack_fffffffffffffed8;
  uint32_t in_stack_fffffffffffffedc;
  const_iterator *in_stack_fffffffffffffee0;
  anon_class_16_2_46e3eac0 *in_stack_fffffffffffffee8;
  uint32_t in_stack_fffffffffffffef0;
  undefined2 in_stack_fffffffffffffef4;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  uint32_t in_stack_fffffffffffffef8;
  uint32_t in_stack_fffffffffffffefc;
  NodeImpl<int,_slang::IntervalMapDetails::LeafNode<int,_int,_16U,_false>_>
  *in_stack_ffffffffffffff00;
  uint32_t in_stack_ffffffffffffff1c;
  interval<int> in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  int iVar5;
  undefined4 in_stack_ffffffffffffff34;
  allocator_type *in_stack_ffffffffffffff38;
  int *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  pointer in_stack_ffffffffffffff50;
  bool local_55;
  
  bVar1 = IntervalMap<int,_int,_0U>::const_iterator::isFlat(in_stack_fffffffffffffee0);
  if (bVar1) {
    IntervalMapDetails::NodeImpl<int,_slang::IntervalMapDetails::LeafNode<int,_int,_16U,_true>_>::
    findUnionLeft((NodeImpl<int,_slang::IntervalMapDetails::LeafNode<int,_int,_16U,_true>_> *)
                  CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                  CONCAT13(in_stack_fffffffffffffef7,
                           CONCAT12(in_stack_fffffffffffffef6,in_stack_fffffffffffffef4)),
                  in_stack_fffffffffffffef0,(interval<int> *)in_stack_fffffffffffffee8);
    IntervalMap<int,_int,_0U>::const_iterator::setRoot
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
  }
  else {
    IntervalMapDetails::NodeImpl<int,_slang::IntervalMapDetails::BranchNode<int,_12U,_true>_>::
    findUnionLeft((NodeImpl<int,_slang::IntervalMapDetails::BranchNode<int,_12U,_true>_> *)
                  CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                  CONCAT13(in_stack_fffffffffffffef7,
                           CONCAT12(in_stack_fffffffffffffef6,in_stack_fffffffffffffef4)),
                  in_stack_fffffffffffffef0,(interval<int> *)in_stack_fffffffffffffee8);
    IntervalMap<int,_int,_0U>::const_iterator::setRoot
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    treeFindUnion(in_RDI);
  }
  bVar1 = IntervalMap<int,_int,_0U>::const_iterator::valid((const_iterator *)0x832a1b);
  if (bVar1) {
    piVar3 = unionWith::anon_class_16_2_3faad3b2::operator()
                       ((anon_class_16_2_3faad3b2 *)
                        CONCAT17(in_stack_fffffffffffffef7,
                                 CONCAT16(in_stack_fffffffffffffef6,
                                          CONCAT24(in_stack_fffffffffffffef4,
                                                   in_stack_fffffffffffffef0))));
    bVar1 = IntervalMapDetails::interval<int>::overlapsOrAdjacent(piVar3,&in_RDI->searchKey);
    if (bVar1) {
      newKey.right._0_2_ = in_stack_fffffffffffffef4;
      newKey.left = in_stack_fffffffffffffef0;
      newKey.right._2_1_ = in_stack_fffffffffffffef6;
      newKey.right._3_1_ = in_stack_fffffffffffffef7;
      unionWith::anon_class_16_2_46e3eac0::operator()(in_stack_fffffffffffffee8,newKey);
      IntervalMapDetails::Path::height((Path *)in_stack_fffffffffffffee0);
      IntervalMap<int,_int,_0U>::iterator::updateParentBounds
                ((iterator *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                 (interval<int> *)
                 CONCAT17(in_stack_fffffffffffffef7,
                          CONCAT16(in_stack_fffffffffffffef6,
                                   CONCAT24(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0))));
    }
    else {
      IntervalMap<int,_int,_0U>::iterator::insert
                ((iterator *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                 in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
    while( true ) {
      while( true ) {
        puVar4 = IntervalMapDetails::Path::leafOffset((Path *)0x832b12);
        i = *puVar4 + 1;
        bVar1 = IntervalMap<int,_int,_0U>::const_iterator::isFlat(in_stack_fffffffffffffee0);
        if (bVar1) {
          this_00 = IntervalMapDetails::Path::
                    leaf<slang::IntervalMapDetails::LeafNode<int,int,16u,true>>((Path *)0x832b3b);
          in_stack_ffffffffffffff1c = i;
          IntervalMapDetails::Path::leafSize((Path *)0x832b68);
          local_55 = IntervalMapDetails::
                     NodeImpl<int,_slang::IntervalMapDetails::LeafNode<int,_int,_16U,_true>_>::
                     canUnionRight((NodeImpl<int,_slang::IntervalMapDetails::LeafNode<int,_int,_16U,_true>_>
                                    *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                                   in_stack_fffffffffffffef8,
                                   (interval<int> *)
                                   CONCAT17(in_stack_fffffffffffffef7,
                                            CONCAT16(in_stack_fffffffffffffef6,
                                                     CONCAT24(in_stack_fffffffffffffef4,
                                                              in_stack_fffffffffffffef0))));
          IntervalMapDetails::LeafNode<int,_int,_16U,_true>::keyAt(this_00,i);
        }
        else {
          this_01 = (NodeImpl<int,_slang::IntervalMapDetails::LeafNode<int,_int,_16U,_false>_> *)
                    IntervalMapDetails::Path::
                    leaf<slang::IntervalMapDetails::LeafNode<int,int,16u,false>>((Path *)0x832bb8);
          in_stack_ffffffffffffff00 = this_01;
          IntervalMapDetails::Path::leafSize((Path *)0x832be5);
          local_55 = IntervalMapDetails::
                     NodeImpl<int,_slang::IntervalMapDetails::LeafNode<int,_int,_16U,_false>_>::
                     canUnionRight(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                                   in_stack_fffffffffffffef8,
                                   (interval<int> *)
                                   CONCAT17(in_stack_fffffffffffffef7,
                                            CONCAT16(in_stack_fffffffffffffef6,
                                                     CONCAT24(in_stack_fffffffffffffef4,
                                                              in_stack_fffffffffffffef0))));
          IntervalMapDetails::LeafNode<int,_int,_16U,_false>::keyAt
                    ((LeafNode<int,_int,_16U,_false> *)this_01,i);
        }
        if (local_55 == false) break;
        newKey_00.right._0_2_ = in_stack_fffffffffffffef4;
        newKey_00.left = in_stack_fffffffffffffef0;
        newKey_00.right._2_1_ = in_stack_fffffffffffffef6;
        newKey_00.right._3_1_ = in_stack_fffffffffffffef7;
        unionWith::anon_class_16_2_46e3eac0::operator()(in_stack_fffffffffffffee8,newKey_00);
        puVar4 = IntervalMapDetails::Path::leafOffset((Path *)0x832c6d);
        *puVar4 = i;
        IntervalMap<int,_int,_0U>::iterator::erase
                  ((iterator *)in_stack_ffffffffffffff28,(allocator_type *)in_RDI,
                   SUB41(in_stack_ffffffffffffff1c >> 0x18,0));
        puVar4 = IntervalMapDetails::Path::leafOffset((Path *)0x832c9f);
        *puVar4 = *puVar4 - 1;
        in_stack_fffffffffffffefc = i;
      }
      uVar2 = IntervalMapDetails::Path::leafSize((Path *)0x832cc3);
      if ((i != uVar2) ||
         (bVar1 = IntervalMap<int,_int,_0U>::const_iterator::isFlat(in_stack_fffffffffffffee0),
         bVar1)) break;
      IntervalMap<int,_int,_0U>::iterator::iterator
                ((iterator *)in_stack_fffffffffffffee0,
                 (iterator *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      IntervalMapDetails::Path::moveRight
                ((Path *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff28.right);
      in_stack_fffffffffffffef7 =
           IntervalMap<int,_int,_0U>::const_iterator::valid((const_iterator *)0x832d16);
      if ((bool)in_stack_fffffffffffffef7) {
        in_stack_fffffffffffffee0 = (const_iterator *)&stack0xffffffffffffff48;
        in_stack_fffffffffffffee8 =
             (anon_class_16_2_46e3eac0 *)
             IntervalMapDetails::Path::leaf<slang::IntervalMapDetails::LeafNode<int,int,16u,false>>
                       ((Path *)0x832d35);
        IntervalMapDetails::Path::leafSize((Path *)0x832d44);
        in_stack_fffffffffffffef6 =
             IntervalMapDetails::
             NodeImpl<int,_slang::IntervalMapDetails::LeafNode<int,_int,_16U,_false>_>::
             canUnionRight(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,i,
                           (interval<int> *)
                           CONCAT17(in_stack_fffffffffffffef7,
                                    CONCAT16(in_stack_fffffffffffffef6,
                                             CONCAT24(in_stack_fffffffffffffef4,
                                                      in_stack_fffffffffffffef0))));
        if (!(bool)in_stack_fffffffffffffef6) goto LAB_00832d6b;
        this_02 = IntervalMapDetails::Path::
                  leaf<slang::IntervalMapDetails::LeafNode<int,int,16u,false>>((Path *)0x832d9f);
        piVar3 = IntervalMapDetails::LeafNode<int,_int,_16U,_false>::keyAt(this_02,0);
        in_stack_ffffffffffffff28 = *piVar3;
        newKey_01.right._0_2_ = in_stack_fffffffffffffef4;
        newKey_01.left = in_stack_fffffffffffffef0;
        newKey_01.right._2_1_ = in_stack_fffffffffffffef6;
        newKey_01.right._3_1_ = in_stack_fffffffffffffef7;
        unionWith::anon_class_16_2_46e3eac0::operator()(in_stack_fffffffffffffee8,newKey_01);
        IntervalMapDetails::Path::height((Path *)in_stack_fffffffffffffee0);
        IntervalMap<int,_int,_0U>::iterator::updateParentBounds
                  ((iterator *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                   (interval<int> *)
                   CONCAT17(in_stack_fffffffffffffef7,
                            CONCAT16(in_stack_fffffffffffffef6,
                                     CONCAT24(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)))
                  );
        bVar1 = IntervalMap<int,_int,_0U>::iterator::erase
                          ((iterator *)in_stack_ffffffffffffff28,(allocator_type *)in_RDI,
                           SUB41(in_stack_ffffffffffffff1c >> 0x18,0));
        in_stack_fffffffffffffedc = CONCAT13(bVar1,(int3)in_stack_fffffffffffffedc);
        if (bVar1) {
          IntervalMapDetails::Path::operator=
                    ((Path *)in_stack_fffffffffffffee0,
                     (Path *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
          IntervalMapDetails::Path::moveLeft
                    ((Path *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     in_stack_ffffffffffffff28.right);
        }
        iVar5 = 0;
      }
      else {
LAB_00832d6b:
        iVar5 = 1;
      }
      IntervalMap<int,_int,_0U>::iterator::~iterator((iterator *)0x832e53);
      if (iVar5 != 0) {
        return;
      }
      in_stack_ffffffffffffff30 = 0;
      in_stack_fffffffffffffef8 = i;
    }
  }
  else {
    IntervalMap<int,_int,_0U>::iterator::insert
              ((iterator *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
               in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::overlap_iterator::unionWith(const TValue& value,
                                                               allocator_type& alloc) {
    using namespace IntervalMapDetails;

    auto& map = *this->map;
    auto& path = this->path;
    if (this->isFlat()) {
        this->setRoot(map.rootLeaf.findUnionLeft(0, map.rootSize, searchKey));
    }
    else {
        this->setRoot(map.rootBranch.findUnionLeft(0, map.rootSize, searchKey));
        treeFindUnion();
    }

    // The iterator now points to one of the following:
    // - The first existing interval that overlaps (or is adjacent to) the search key
    // - The correct place to insert the search key as a new interval
    // - The end of the map (also the correct place to insert)
    if (!valid()) {
        // We're at the end of the map so just insert and we're done.
        this->insert(searchKey.left, searchKey.right, value, alloc);
        return;
    }

    auto getCurrKey = [&]() -> interval<TKey>& {
        auto offset = path.leafOffset();
        return this->isFlat() ? path.template leaf<RootLeaf>().keyAt(offset)
                              : path.template leaf<Leaf>().keyAt(offset);
    };

    auto updateCurrKey = [&](interval<TKey> newKey) {
        // Expand the current entry to match our new item.
        auto& currKey = getCurrKey();
        currKey.unionWith(newKey);
        searchKey = currKey;
    };

    if (!getCurrKey().overlapsOrAdjacent(searchKey)) {
        this->insert(searchKey.left, searchKey.right, value, alloc);
    }
    else {
        // Otherwise expand the current entry to match our new item.
        updateCurrKey(searchKey);
        this->updateParentBounds(path.height(), searchKey);
    }

    // Our new interval is inserted or updated. Continue forward and
    // merge all later intervals that overlap with this one.
    while (true) {
        uint32_t offset = path.leafOffset() + 1;
        bool canUnionRight;
        interval<TKey> currKey;
        if (this->isFlat()) {
            auto& leaf = path.template leaf<RootLeaf>();
            canUnionRight = leaf.canUnionRight(offset, path.leafSize(), searchKey);
            currKey = leaf.keyAt(offset);
        }
        else {
            auto& leaf = path.template leaf<Leaf>();
            canUnionRight = leaf.canUnionRight(offset, path.leafSize(), searchKey);
            currKey = leaf.keyAt(offset);
        }

        if (canUnionRight) {
            // This does not change our parent bounds so no need to update.
            updateCurrKey(currKey);

            path.leafOffset() = offset;
            bool modifiedPath = this->erase(alloc, false);
            SLANG_ASSERT(!modifiedPath);

            path.leafOffset()--;
        }
        else if (offset == path.leafSize() && !this->isFlat()) {
            // Copy our iterator and advance to the next node to see if we can merge
            // with it. This intentionally slices the object since we don't need the
            // wider overlapped_iterator here.
            iterator nextIt = *this;
            nextIt.path.moveRight(map.height);
            if (!nextIt.valid() || !nextIt.path.template leaf<Leaf>().canUnionRight(
                                       0, nextIt.path.leafSize(), searchKey)) {
                // Nope, we're done.
                return;
            }

            // Merge and erase the next elem.
            updateCurrKey(nextIt.path.template leaf<Leaf>().keyAt(0));
            this->updateParentBounds(path.height(), searchKey);

            if (nextIt.erase(alloc, true)) {
                // The erase operation deleted nodes so our path is invalid.
                // Get back to a good state by copying from the nextIt's path
                // and then moving back left.
                path = nextIt.path;
                path.moveLeft(map.height);
            }
        }
        else {
            return;
        }
    }
}